

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEvents.cpp
# Opt level: O1

void TTD::NSLogEvents::PropertyEnumStepEventLogEntry_Parse
               (EventLogEntry *evt,ThreadContext *threadContext,FileReader *reader,
               UnlinkableSlabAllocator *alloc)

{
  EventKind EVar1;
  uint32 uVar2;
  
  if (evt->EventKind != PropertyEnumTag) {
    TTDAbort_unrecoverable_error("Bad tag match!");
  }
  EVar1 = (*reader->_vptr_FileReader[10])(reader,10,1);
  evt[1].EventKind = EVar1 & 0xff;
  uVar2 = FileReader::ReadUInt32(reader,propertyId,true);
  evt[1].ResultStatus = uVar2;
  uVar2 = FileReader::ReadUInt32(reader,attributeFlags,true);
  *(char *)&evt[1].EventTimeStamp = (char)uVar2;
  InitializeAsNullPtrTTString((TTString *)(evt + 2));
  if (evt[1].EventKind != Invalid) {
    (*reader->_vptr_FileReader[3])(reader,0x11,1);
    (*reader->_vptr_FileReader[0x14])(reader,alloc,evt + 2,0);
    return;
  }
  return;
}

Assistant:

void PropertyEnumStepEventLogEntry_Parse(EventLogEntry* evt, ThreadContext* threadContext, FileReader* reader, UnlinkableSlabAllocator& alloc)
        {
            PropertyEnumStepEventLogEntry* propertyEvt = GetInlineEventDataAs<PropertyEnumStepEventLogEntry, EventKind::PropertyEnumTag>(evt);

            propertyEvt->ReturnCode = reader->ReadBool(NSTokens::Key::boolVal, true);
            propertyEvt->Pid = (Js::PropertyId)reader->ReadUInt32(NSTokens::Key::propertyId, true);
            propertyEvt->Attributes = (Js::PropertyAttributes)reader->ReadUInt32(NSTokens::Key::attributeFlags, true);

            InitializeAsNullPtrTTString(propertyEvt->PropertyString);

            if(propertyEvt->ReturnCode)
            {
#if ENABLE_TTD_INTERNAL_DIAGNOSTICS
                reader->ReadString(NSTokens::Key::stringVal, alloc, propertyEvt->PropertyString, true);
#else
                if(propertyEvt->Pid == Js::Constants::NoProperty)
                {
                    reader->ReadString(NSTokens::Key::stringVal, alloc, propertyEvt->PropertyString, true);
                }
#endif
            }
        }